

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type
time_plain<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *r)

{
  long lVar1;
  ulong uVar2;
  result_type rVar3;
  long lVar4;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = r->_M_x;
  lVar4 = 0x1000000;
  rVar3 = 0;
  do {
    uVar2 = (uVar2 * 0x41a7) % 0x7fffffff;
    rVar3 = rVar3 + uVar2;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  r->_M_x = uVar2;
  lVar4 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar4 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}